

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCountOnesInCofsFast(word *pTruth,int nVars,int *pStore)

{
  word Truth;
  int iVar1;
  int *pStore_local;
  int nVars_local;
  word *pTruth_local;
  
  memset(pStore,0,(long)nVars << 2);
  if (2 < nVars) {
    if (nVars < 7) {
      Truth = *pTruth;
      iVar1 = Abc_TtByteNum(nVars);
      pTruth_local._4_4_ = Abc_TtCountOnesInCofsFast6_rec(Truth,nVars + -1,iVar1,pStore);
    }
    else {
      iVar1 = Abc_TtWordNum(nVars);
      pTruth_local._4_4_ = Abc_TtCountOnesInCofsFast_rec(pTruth,nVars + -1,iVar1,pStore);
    }
    return pTruth_local._4_4_;
  }
  __assert_fail("nVars >= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                ,0x233,"int Abc_TtCountOnesInCofsFast(word *, int, int *)");
}

Assistant:

int Abc_TtCountOnesInCofsFast( word * pTruth, int nVars, int * pStore )
{
    memset( pStore, 0, sizeof(int) * nVars );
    assert( nVars >= 3 );
    if ( nVars <= 6 )
        return Abc_TtCountOnesInCofsFast6_rec( pTruth[0], nVars - 1, Abc_TtByteNum( nVars ), pStore );
    else
        return Abc_TtCountOnesInCofsFast_rec( pTruth, nVars - 1, Abc_TtWordNum( nVars ), pStore );
}